

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O3

uint32_t __thiscall arith_uint256::GetCompact(arith_uint256 *this,bool fNegative)

{
  uint uVar1;
  base_uint<256U> *b;
  sbyte sVar2;
  uint uVar3;
  long in_FS_OFFSET;
  base_uint<256U> local_70;
  base_uint<256U> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = base_uint<256U>::bits(&this->super_base_uint<256U>);
  uVar3 = uVar1 + 7;
  if (uVar3 < 0x20) {
    local_70.pn[0] =
         (uint32_t)(*(long *)(this->super_base_uint<256U>).pn << (0x18U - (char)uVar1 & 0x18));
  }
  else {
    base_uint<256U>::base_uint(&local_50,&this->super_base_uint<256U>);
    b = base_uint<256U>::operator>>=(&local_50,(uVar3 & 0xfffffff8) - 0x18);
    base_uint<256U>::base_uint(&local_70,b);
  }
  sVar2 = (sbyte)((local_70.pn[0] & 0x800000) >> 0x14);
  uVar1 = local_70.pn[0] >> sVar2;
  if (0x7fffff < uVar1) {
    __assert_fail("(nCompact & ~0x007fffffU) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/arith_uint256.cpp"
                  ,0xd3,"uint32_t arith_uint256::GetCompact(bool) const");
  }
  uVar3 = ((local_70.pn[0] & 0x800000) >> 0x17) + (uVar3 >> 3);
  if (0xff < uVar3) {
    __assert_fail("nSize < 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/arith_uint256.cpp"
                  ,0xd4,"uint32_t arith_uint256::GetCompact(bool) const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (uint)(local_70.pn[0] >> sVar2 != 0 && fNegative) << 0x17 | uVar3 * 0x1000000 | uVar1;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t arith_uint256::GetCompact(bool fNegative) const
{
    int nSize = (bits() + 7) / 8;
    uint32_t nCompact = 0;
    if (nSize <= 3) {
        nCompact = GetLow64() << 8 * (3 - nSize);
    } else {
        arith_uint256 bn = *this >> 8 * (nSize - 3);
        nCompact = bn.GetLow64();
    }
    // The 0x00800000 bit denotes the sign.
    // Thus, if it is already set, divide the mantissa by 256 and increase the exponent.
    if (nCompact & 0x00800000) {
        nCompact >>= 8;
        nSize++;
    }
    assert((nCompact & ~0x007fffffU) == 0);
    assert(nSize < 256);
    nCompact |= nSize << 24;
    nCompact |= (fNegative && (nCompact & 0x007fffff) ? 0x00800000 : 0);
    return nCompact;
}